

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

bool_t wwIsW(word *a,size_t n,word w)

{
  uint uVar1;
  long lVar2;
  
  if (n == 0) {
    uVar1 = (uint)(w == 0);
  }
  else {
    uVar1 = (uint)(*a == w);
    lVar2 = n - 1;
    while (lVar2 != 0) {
      uVar1 = uVar1 & a[lVar2] == 0;
      lVar2 = lVar2 + -1;
    }
  }
  return uVar1;
}

Assistant:

bool_t SAFE(wwIsW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = wordEq(w, 0);
	else
	{
		ret = wordEq(a[0], w);
		while (--n)
			ret &= wordEq(a[n], 0);
	}
	w = 0;
	return ret;
}